

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O2

bool __thiscall ON_Mesh::DeleteComponents(ON_Mesh *this,ON_COMPONENT_INDEX *ci_list,size_t ci_count)

{
  bool bVar1;
  
  if (ci_count == 0) {
    return true;
  }
  if (ci_list != (ON_COMPONENT_INDEX *)0x0) {
    bVar1 = DeleteComponents(this,ci_list,ci_count,true,false,true,true);
    return bVar1;
  }
  return false;
}

Assistant:

bool ON_Mesh::DeleteComponents(
  const ON_COMPONENT_INDEX* ci_list,
  size_t ci_count
  )
{
  if (ci_count <= 0)
    return true;

  if (nullptr == ci_list)
    return false;

  bool bIgnoreInvalidComponents = true;
  bool bRemoveDegenerateFaces = false;
  bool bRemoveUnusedVertices = true;
  bool bRemoveEmptyNgons = true;

  return DeleteComponents(
  ci_list,ci_count,
  bIgnoreInvalidComponents,
  bRemoveDegenerateFaces,
  bRemoveUnusedVertices,
  bRemoveEmptyNgons
  );
}